

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_FieldValueNodeMissingEnumAttribute::
TestreadFromDocument_FieldValueNodeMissingEnumAttribute
          (TestreadFromDocument_FieldValueNodeMissingEnumAttribute *this)

{
  char *suiteName;
  TestreadFromDocument_FieldValueNodeMissingEnumAttribute *this_local;
  
  suiteName = SuiteDataDictionaryTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"readFromDocument_FieldValueNodeMissingEnumAttribute",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DataDictionaryTestCase.cpp"
             ,0x542);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestreadFromDocument_FieldValueNodeMissingEnumAttribute_00456eb0;
  return;
}

Assistant:

TEST(readFromDocument_FieldValueNodeMissingEnumAttribute) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml =
      "<fix type='FIX' major='4' minor='2' servicepack='0'>"
        "<fields>"
          "<field number='8' name='BeginString' type='STRING' >"
            "<value description='SINGLE_SECURITY' />" // enum attribute missing
          "</field>"
        "</fields>"
      "</fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}